

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront_workitems_soa.h
# Opt level: O0

RayWorkItem * __thiscall
pbrt::SOA<pbrt::RayWorkItem>::operator[](SOA<pbrt::RayWorkItem> *this,int i)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_EDX;
  long in_RSI;
  RayWorkItem *in_RDI;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar11;
  RayWorkItem *r;
  Ray *in_stack_ffffffffffffff18;
  RayWorkItem *in_stack_ffffffffffffff20;
  Ray *this_00;
  undefined1 local_c0 [12];
  int in_stack_ffffffffffffff4c;
  SOA<pbrt::SampledSpectrum> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  SOA<pbrt::SampledWavelengths> *in_stack_ffffffffffffff70;
  SOA<pbrt::LightSampleContext> *this_01;
  undefined8 local_60;
  ulong uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  Ray local_40;
  int local_14;
  
  local_14 = in_EDX;
  RayWorkItem::RayWorkItem(in_stack_ffffffffffffff20);
  this_00 = &local_40;
  SOA<pbrt::Ray>::operator[]
            ((SOA<pbrt::Ray> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff64);
  Ray::operator=(this_00,in_stack_ffffffffffffff18);
  in_RDI->depth = *(int *)(*(long *)(in_RSI + 0x60) + (long)local_14 * 4);
  in_RDI->pixelIndex = *(int *)(*(long *)(in_RSI + 0x68) + (long)local_14 * 4);
  SOA<pbrt::SampledWavelengths>::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(undefined8 *)(in_RDI->lambda).lambda.values = local_60;
  *(ulong *)((in_RDI->lambda).lambda.values + 2) = uStack_58;
  *(undefined8 *)(in_RDI->lambda).pdf.values = uStack_50;
  *(undefined8 *)((in_RDI->lambda).pdf.values + 2) = uStack_48;
  auVar10 = ZEXT856(uStack_58);
  SVar11 = SOA<pbrt::SampledSpectrum>::operator[]
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  auVar7._0_8_ = SVar11.values.values._0_8_;
  auVar7._8_56_ = auVar10;
  uVar1 = vmovlpd_avx(auVar7._0_16_);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar11.values.values._8_8_;
  uVar2 = vmovlpd_avx(auVar4);
  auVar10 = ZEXT856(uVar2);
  *(undefined8 *)(in_RDI->beta).values.values = uVar1;
  *(ulong *)((in_RDI->beta).values.values + 2) = uVar2;
  SVar11 = SOA<pbrt::SampledSpectrum>::operator[]
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  auVar8._0_8_ = SVar11.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  this_01 = (SOA<pbrt::LightSampleContext> *)vmovlpd_avx(auVar8._0_16_);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = SVar11.values.values._8_8_;
  uVar2 = vmovlpd_avx(auVar5);
  auVar10 = ZEXT856(uVar2);
  *(SOA<pbrt::LightSampleContext> **)(in_RDI->r_u).values.values = this_01;
  *(ulong *)((in_RDI->r_u).values.values + 2) = uVar2;
  SVar11 = SOA<pbrt::SampledSpectrum>::operator[]
                     (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  auVar9._0_8_ = SVar11.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = SVar11.values.values._8_8_;
  uVar3 = vmovlpd_avx(auVar6);
  *(undefined8 *)(in_RDI->r_l).values.values = uVar1;
  *(undefined8 *)((in_RDI->r_l).values.values + 2) = uVar3;
  SOA<pbrt::LightSampleContext>::operator[](this_01,(int)((ulong)uVar3 >> 0x20));
  memcpy(&in_RDI->prevIntrCtx,local_c0,0x30);
  in_RDI->etaScale = *(Float *)(*(long *)(in_RSI + 0x178) + (long)local_14 * 4);
  in_RDI->specularBounce = *(int *)(*(long *)(in_RSI + 0x180) + (long)local_14 * 4);
  in_RDI->anyNonSpecularBounces = *(int *)(*(long *)(in_RSI + 0x188) + (long)local_14 * 4);
  return in_RDI;
}

Assistant:

operator[](int i) const {
        DCHECK_LT(i, nAlloc);
        RayWorkItem r;
        r.ray = this->ray[i];
        r.depth = this->depth[i];
        r.pixelIndex = this->pixelIndex[i];
        r.lambda = this->lambda[i];
        r.beta = this->beta[i];
        r.r_u = this->r_u[i];
        r.r_l = this->r_l[i];
        r.prevIntrCtx = this->prevIntrCtx[i];
        r.etaScale = this->etaScale[i];
        r.specularBounce = this->specularBounce[i];
        r.anyNonSpecularBounces = this->anyNonSpecularBounces[i];
        return r;
    }